

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_column_decltype(sqlite3_stmt *pStmt,int N)

{
  ushort uVar1;
  long lVar2;
  char *pcVar3;
  
  uVar1 = *(ushort *)(pStmt + 0x48);
  if ((uint)N < (uint)uVar1) {
    lVar2 = *(long *)pStmt;
    if (*(sqlite3_mutex **)(lVar2 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 0x18));
    }
    pcVar3 = (char *)sqlite3ValueText((sqlite3_value *)
                                      ((ulong)((uint)uVar1 + N) * 0x38 + *(long *)(pStmt + 0x20)),
                                      '\x01');
    if (*(char *)(lVar2 + 0x50) != '\0') {
      *(undefined1 *)(lVar2 + 0x50) = 0;
      pcVar3 = (char *)0x0;
    }
    if (*(sqlite3_mutex **)(lVar2 + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar2 + 0x18));
    }
  }
  else {
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *sqlite3_column_decltype(sqlite3_stmt *pStmt, int N){
  return columnName(
      pStmt, N, (const void*(*)(Mem*))sqlite3_value_text, COLNAME_DECLTYPE);
}